

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O1

string * __thiscall wabt::Token::to_string_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  TokenType TVar1;
  Type TVar2;
  pointer pcVar3;
  size_type sVar4;
  Info local_40;
  
  TVar1 = this->token_type_;
  if ((ulong)TVar1 < 0x26) {
    local_40.name = GetTokenTypeName::s_names[TVar1];
    goto LAB_00f65f72;
  }
  if (TVar1 - First_Literal < 3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (pointer)(this->field_2).text_._M_string_length;
    sVar4 = (this->field_2).literal_.text._M_string_length;
LAB_00f65f97:
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + sVar4);
    return __return_storage_ptr__;
  }
  if (TVar1 - AtomicLoad < 0x34) {
    Opcode::GetInfo(&local_40,&(this->field_2).opcode_);
    goto LAB_00f65f72;
  }
  if (TVar1 - AlignEqNat < 5) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (this->field_2).text_._M_dataplus._M_p;
    sVar4 = (this->field_2).text_._M_string_length;
    goto LAB_00f65f97;
  }
  if (TVar1 != First_Type) {
    __assert_fail("HasType()",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/token.cc"
                  ,0x92,"std::string wabt::Token::to_string() const");
  }
  TVar2 = (this->field_2).type_;
  if (TVar2 < Anyfunc) {
    if (TVar2 == Void) {
      local_40.name = "void";
      goto LAB_00f65f72;
    }
    if (TVar2 == Func) {
      local_40.name = "func";
      goto LAB_00f65f72;
    }
    if (TVar2 == ExceptRef) {
      local_40.name = "except_ref";
      goto LAB_00f65f72;
    }
switchD_00f66012_caseD_fffffff1:
    local_40.name = "<type index>";
  }
  else {
    switch(TVar2) {
    case Any:
      local_40.name = "any";
      break;
    case Anyfunc:
      local_40.name = "anyfunc";
      break;
    default:
      goto switchD_00f66012_caseD_fffffff1;
    case V128:
      local_40.name = "v128";
      break;
    case F64:
      local_40.name = "f64";
      break;
    case F32:
      local_40.name = "f32";
      break;
    case I64:
      local_40.name = "i64";
      break;
    case I32:
      local_40.name = "i32";
    }
  }
LAB_00f65f72:
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,local_40.name,(allocator *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string Token::to_string() const {
  if (IsTokenTypeBare(token_type_)) {
    return GetTokenTypeName(token_type_);
  } else if (HasLiteral()) {
    return literal_.text;
  } else if (HasOpcode()) {
    return opcode_.GetName();
  } else if (HasText()) {
    return text_;
  } else {
    assert(HasType());
    return GetTypeName(type_);
  }
}